

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
cmELF::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,cmELF *this,
          DynamicEntryList *dentries)

{
  _Head_base<0UL,_cmELFInternal_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->Internal)._M_t.
       super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
       super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
       super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl == (cmELFInternal *)0x0) ||
     ((_Var1._M_head_impl)->ELFType == FileTypeInvalid)) {
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_cmELFInternal + 0x28))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELF::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& dentries) const
{
  if (this->Valid()) {
    return this->Internal->EncodeDynamicEntries(dentries);
  }

  return std::vector<char>();
}